

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

void adios2::helper::HandshakeReader
               (Comm *comm,size_t *appID,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fullAddresses,string *name,string *engineName)

{
  int iVar1;
  size_t sVar2;
  json j;
  vector<char,_std::allocator<char>_> address;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  string engineFilename;
  string engineLockFilename;
  FileFStream ipstream;
  FileFStream lockstream;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockstream,
                 name,".");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ipstream,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockstream,
                 engineName);
  std::operator+(&engineLockFilename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ipstream,
                 ".lock");
  std::__cxx11::string::~string((string *)&ipstream);
  std::__cxx11::string::~string((string *)&lockstream);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ipstream,name
                 ,".");
  std::operator+(&engineFilename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ipstream,
                 engineName);
  std::__cxx11::string::~string((string *)&ipstream);
  AvailableIpAddresses_abi_cxx11_();
  if (ips.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      ips.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = rand();
    sVar2 = (size_t)iVar1;
  }
  else {
    sVar2 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&ipstream,
                       ips.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  *appID = sVar2;
  Comm::BroadcastValue<unsigned_long>(comm,appID,0);
  transport::FileFStream::FileFStream(&ipstream,comm);
  transport::FileFStream::Open(&ipstream,&engineFilename,Read,false,false);
  transport::FileFStream::FileFStream(&lockstream,comm);
  do {
    transport::FileFStream::Open(&lockstream,&engineLockFilename,Read,false,false);
    transport::FileFStream::Close(&lockstream);
  } while( true );
}

Assistant:

void HandshakeReader(Comm const &comm, size_t &appID, std::vector<std::string> &fullAddresses,
                     const std::string &name, const std::string &engineName)
{
    const std::string engineLockFilename = name + "." + engineName + ".lock";
    const std::string engineFilename = name + "." + engineName;

    auto ips = helper::AvailableIpAddresses();
    if (ips.empty())
    {
        appID = rand();
    }
    else
    {
        std::hash<std::string> hash_fn;
        appID = hash_fn(ips[0]);
    }
    comm.BroadcastValue(appID);

    transport::FileFStream ipstream(comm);
    while (true)
    {
        try
        {
            ipstream.Open(engineFilename, Mode::Read);
            break;
        }
        catch (...)
        {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
        }
    }

    transport::FileFStream lockstream(comm);
    while (true)
    {
        try
        {
            lockstream.Open(engineLockFilename, Mode::Read);
            lockstream.Close();
        }
        catch (...)
        {
            break;
        }
    }

    auto size = ipstream.GetSize();
    std::vector<char> address(size);
    ipstream.Read(address.data(), size);
    ipstream.Close();
    nlohmann::json j = nlohmann::json::parse(address);
    fullAddresses = j.get<std::vector<std::string>>();
}